

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

char * cimg_library::cimg::curl_path(char *user_path,bool reinit_path)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  FILE *file;
  bool path_found;
  bool reinit_path_local;
  char *user_path_local;
  
  if ((curl_path(char_const*,bool)::s_path == '\0') &&
     (iVar1 = __cxa_guard_acquire(&curl_path(char_const*,bool)::s_path), iVar1 != 0)) {
    CImg<char>::CImg(&curl_path::s_path);
    __cxa_atexit(CImg<char>::~CImg,&curl_path::s_path,&__dso_handle);
    __cxa_guard_release(&curl_path(char_const*,bool)::s_path);
  }
  mutex(7,1);
  if (reinit_path) {
    CImg<char>::assign(&curl_path::s_path);
  }
  if (user_path == (char *)0x0) {
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
    if (pcVar2 == (char *)0x0) {
      CImg<char>::assign(&curl_path::s_path,0x400,1,1,1);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
      strcpy(pcVar2,"./curl");
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
      __stream = (FILE *)std_fopen(pcVar2,"r");
      if (__stream == (FILE *)0x0) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
        strcpy(pcVar2,"curl");
      }
      else {
        fclose(__stream);
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
      winformat_string(pcVar2);
    }
  }
  else {
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
    if (pcVar2 == (char *)0x0) {
      CImg<char>::assign(&curl_path::s_path,0x400,1,1,1);
    }
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
    strncpy(pcVar2,user_path,0x3ff);
  }
  mutex(7,0);
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&curl_path::s_path);
  return pcVar2;
}

Assistant:

inline const char *curl_path(const char *const user_path, const bool reinit_path) {
      static CImg<char> s_path;
      cimg::mutex(7);
      if (reinit_path) s_path.assign();
      if (user_path) {
        if (!s_path) s_path.assign(1024);
        std::strncpy(s_path,user_path,1023);
      } else if (!s_path) {
        s_path.assign(1024);
        bool path_found = false;
        std::FILE *file = 0;
#if cimg_OS==2
        if (!path_found) {
          std::strcpy(s_path,".\\curl.exe");
          if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(s_path,"curl.exe");
#else
        if (!path_found) {
          std::strcpy(s_path,"./curl");
          if ((file=cimg::std_fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(s_path,"curl");
#endif
        winformat_string(s_path);
      }
      cimg::mutex(7,0);
      return s_path;
    }